

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::MsgBoxButton::minimumSizeHint(MsgBoxButton *this)

{
  int iVar1;
  MsgBoxButtonPrivate *pMVar2;
  int *piVar3;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  QMargins local_88;
  QRect local_78;
  undefined1 local_68 [12];
  QRect local_5c;
  QRect local_4c;
  QSize local_3c;
  QSize s;
  QWidget local_28 [12];
  int local_1c;
  MsgBoxButton *pMStack_18;
  int margin;
  MsgBoxButton *this_local;
  
  pMStack_18 = this;
  QWidget::fontMetrics(local_28);
  iVar1 = QFontMetrics::height();
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_28);
  local_1c = iVar1 / 3;
  QWidget::fontMetrics((QWidget *)local_68);
  QRect::QRect(&local_78);
  pMVar2 = QScopedPointer<QtMWidgets::MsgBoxButtonPrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxButtonPrivate>_>
           ::operator->(&this->d);
  local_5c = (QRect)QFontMetrics::boundingRect
                              ((QRect *)local_68,(int)&local_78,(QString *)0x84,(int)pMVar2 + 8,
                               (int *)0x0);
  QMargins::QMargins(&local_88,local_1c,local_1c,local_1c,local_1c);
  local_4c = QRect::marginsAdded(&local_5c,&local_88);
  local_3c = QRect::size(&local_4c);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_68);
  local_8c = QSize::width(&local_3c);
  local_90 = FingerGeometry::width();
  piVar3 = qMax<int>(&local_8c,&local_90);
  iVar1 = *piVar3;
  local_94 = QSize::height(&local_3c);
  local_98 = FingerGeometry::height();
  piVar3 = qMax<int>(&local_94,&local_98);
  QSize::QSize((QSize *)&this_local,iVar1,*piVar3);
  return (QSize)this_local;
}

Assistant:

QSize
MsgBoxButton::minimumSizeHint() const
{
	const int margin = fontMetrics().height() / 3;

	const QSize s = fontMetrics()
		.boundingRect( QRect(), Qt::AlignCenter, d->text )
		.marginsAdded( QMargins( margin, margin, margin, margin ) )
		.size();

	return QSize( qMax( s.width(), FingerGeometry::width() ),
		qMax( s.height(), FingerGeometry::height() ) );
}